

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralActivity::IfcStructuralActivity(IfcStructuralActivity *this)

{
  IfcStructuralActivity *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x138,"IfcStructuralActivity");
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__0108f9c0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralActivity,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralActivity,_2UL> *)
             &(this->super_IfcProduct).field_0x100,&PTR_construction_vtable_24__0108fa70);
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x108f8e0;
  *(undefined8 *)&this->field_0x138 = 0x108f9a8;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x108f908;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x108f930;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0x108f958;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0x108f980;
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::NotImplemented> *)&(this->super_IfcProduct).field_0x110,
             (LazyObject *)0x0);
  std::__cxx11::string::string((string *)&this->GlobalOrLocal);
  return;
}

Assistant:

IfcStructuralActivity() : Object("IfcStructuralActivity") {}